

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_specialspot.cpp
# Opt level: O3

int AF_DSpotState_GetNextInList
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  PClass *pPVar1;
  int iVar2;
  undefined4 extraout_var;
  FSpotList *this;
  ASpecialSpot *val;
  PClassActor *pPVar4;
  PClassActor *type;
  char *pcVar5;
  DSpotState *this_00;
  int iVar6;
  bool bVar7;
  PClass *pPVar3;
  
  pPVar1 = DSpotState::RegistrationInfo.MyClass;
  if (numparam < 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004bb408;
  }
  if ((param->field_0).field_3.Type != '\x03') {
LAB_004bb3ef:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004bb408:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x149,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  this_00 = (DSpotState *)(param->field_0).field_1.a;
  if ((param->field_0).field_1.atag == 1) {
    if (this_00 == (DSpotState *)0x0) goto LAB_004bb31f;
    pPVar3 = (this_00->super_DThinker).super_DObject.Class;
    if (pPVar3 == (PClass *)0x0) {
      iVar2 = (**(this_00->super_DThinker).super_DObject._vptr_DObject)(this_00);
      pPVar3 = (PClass *)CONCAT44(extraout_var,iVar2);
      (this_00->super_DThinker).super_DObject.Class = pPVar3;
    }
    bVar7 = pPVar3 != (PClass *)0x0;
    if (pPVar3 != pPVar1 && bVar7) {
      do {
        pPVar3 = pPVar3->ParentClass;
        bVar7 = pPVar3 != (PClass *)0x0;
        if (pPVar3 == pPVar1) break;
      } while (pPVar3 != (PClass *)0x0);
    }
    if (!bVar7) {
      pcVar5 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(DSpotState))";
      goto LAB_004bb408;
    }
  }
  else {
    if (this_00 != (DSpotState *)0x0) goto LAB_004bb3ef;
LAB_004bb31f:
    this_00 = (DSpotState *)0x0;
  }
  if (numparam == 1) {
    pcVar5 = "(paramnum) < numparam";
    goto LAB_004bb427;
  }
  if (param[1].field_0.field_3.Type != '\x03') {
LAB_004bb3f8:
    pcVar5 = 
    "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
    ;
LAB_004bb427:
    __assert_fail(pcVar5,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                  ,0x14a,
                  "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                 );
  }
  type = (PClassActor *)param[1].field_0.field_1.a;
  if (param[1].field_0.field_1.atag == 1) {
    if (type != (PClassActor *)0x0) {
      pPVar4 = type;
      if (type != (PClassActor *)AActor::RegistrationInfo.MyClass) {
        do {
          pPVar4 = (PClassActor *)(pPVar4->super_PClass).ParentClass;
          if (pPVar4 == (PClassActor *)AActor::RegistrationInfo.MyClass) break;
        } while (pPVar4 != (PClassActor *)0x0);
        if (pPVar4 == (PClassActor *)0x0) {
          pcVar5 = "type == NULL || type->IsDescendantOf(RUNTIME_CLASS(AActor))";
          goto LAB_004bb427;
        }
      }
      goto LAB_004bb382;
    }
  }
  else if (type != (PClassActor *)0x0) goto LAB_004bb3f8;
  type = (PClassActor *)0x0;
LAB_004bb382:
  if (numparam < 3) {
    pcVar5 = "(paramnum) < numparam";
  }
  else {
    if (param[2].field_0.field_3.Type == '\0') {
      iVar2 = param[2].field_0.i;
      this = DSpotState::FindSpotList(this_00,type);
      iVar6 = 0;
      if (this == (FSpotList *)0x0) {
        val = (ASpecialSpot *)0x0;
      }
      else {
        val = FSpotList::GetNextInList(this,iVar2);
      }
      if (0 < numret) {
        if (ret == (VMReturn *)0x0) {
          __assert_fail("ret != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                        ,0x14c,
                        "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar6 = 1;
        VMReturn::SetPointer(ret,val,1);
      }
      return iVar6;
    }
    pcVar5 = "param[paramnum].Type == REGT_INT";
  }
  __assert_fail(pcVar5,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_specialspot.cpp"
                ,0x14b,
                "int AF_DSpotState_GetNextInList(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(DSpotState, GetNextInList)
{
	PARAM_SELF_PROLOGUE(DSpotState);
	PARAM_CLASS(type, AActor);
	PARAM_INT(skipcounter);
	ACTION_RETURN_OBJECT(self->GetNextInList(type, skipcounter));
}